

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

int Scl_LibertyReadCellIsFlop(Scl_Tree_t *p,Scl_Item_t *pCell)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  Scl_Item_t *pSVar5;
  int iVar6;
  int iVar7;
  
  uVar1 = pCell->Child;
  iVar2 = p->nItems;
  if (iVar2 <= (int)uVar1) {
LAB_0045cf06:
    __assert_fail("v < p->nItems",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                  ,0x4d,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
  }
  if ((int)uVar1 < 0) {
    pSVar5 = (Scl_Item_t *)0x0;
  }
  else {
    pSVar5 = p->pItems + uVar1;
  }
  if (pSVar5 != (Scl_Item_t *)0x0) {
    pcVar3 = p->pContents;
    do {
      iVar6 = (pSVar5->Key).Beg;
      iVar7 = (pSVar5->Key).End - iVar6;
      iVar4 = strncmp(pcVar3 + iVar6,"ff",(long)iVar7);
      if (iVar7 == 2 && iVar4 == 0) {
        return 1;
      }
      iVar4 = strncmp(pcVar3 + iVar6,"latch",(long)iVar7);
      if ((iVar4 == 0) && (iVar7 == 5)) {
        return 1;
      }
      uVar1 = pSVar5->Next;
      if (iVar2 <= (int)uVar1) goto LAB_0045cf06;
      if ((int)uVar1 < 0) {
        pSVar5 = (Scl_Item_t *)0x0;
      }
      else {
        pSVar5 = p->pItems + uVar1;
      }
    } while (pSVar5 != (Scl_Item_t *)0x0);
  }
  return 0;
}

Assistant:

int Scl_LibertyReadCellIsFlop( Scl_Tree_t * p, Scl_Item_t * pCell )
{
    Scl_Item_t * pAttr;
    Scl_ItemForEachChild( p, pCell, pAttr )
        if ( !Scl_LibertyCompare(p, pAttr->Key, "ff") ||
             !Scl_LibertyCompare(p, pAttr->Key, "latch") )
            return 1;
    return 0;
}